

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

long Eigen::internal::first_aligned<int,long>(int *array,long size)

{
  long *plVar1;
  ulong local_28;
  long local_20;
  long size_local;
  int *array_local;
  
  array_local = (int *)size;
  if (((ulong)array & 3) == 0) {
    local_28 = 4 - ((ulong)array >> 2 & 3) & 3;
    local_20 = size;
    size_local = (long)array;
    plVar1 = std::min<long>((long *)&local_28,&local_20);
    array_local = (int *)*plVar1;
  }
  return (long)array_local;
}

Assistant:

static inline Index first_aligned(const Scalar* array, Index size)
{
  static const Index PacketSize = packet_traits<Scalar>::size;
  static const Index PacketAlignedMask = PacketSize-1;

  if(PacketSize==1)
  {
    // Either there is no vectorization, or a packet consists of exactly 1 scalar so that all elements
    // of the array have the same alignment.
    return 0;
  }
  else if(size_t(array) & (sizeof(Scalar)-1))
  {
    // There is vectorization for this scalar type, but the array is not aligned to the size of a single scalar.
    // Consequently, no element of the array is well aligned.
    return size;
  }
  else
  {
    return std::min<Index>( (PacketSize - (Index((size_t(array)/sizeof(Scalar))) & PacketAlignedMask))
                           & PacketAlignedMask, size);
  }
}